

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *p_v,float v_speed,void *p_min,
                        void *p_max,char *format,ImGuiSliderFlags flags)

{
  undefined1 uVar1;
  undefined2 uVar2;
  ImGuiContext *pIVar3;
  undefined8 *in_RCX;
  undefined2 *in_RDX;
  undefined4 in_ESI;
  ImGuiID in_EDI;
  longlong *in_R8;
  uint in_stack_00000008;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  bool r;
  ImS32 v32;
  ImGuiContext *g;
  undefined8 in_stack_fffffffffffffec8;
  ImGuiSliderFlags flags_00;
  undefined4 in_stack_fffffffffffffed0;
  ImGuiSliderFlags in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  float v_max;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float *in_stack_fffffffffffffee8;
  longlong v_min;
  ImGuiDataType data_type_00;
  undefined8 in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  longlong *v;
  ImGuiDataType in_stack_ffffffffffffff00;
  ImGuiSliderFlags in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff24;
  unsigned_long_long *in_stack_ffffffffffffff28;
  ImGuiDataType in_stack_ffffffffffffff30;
  bool local_1;
  
  pIVar3 = GImGui;
  if (GImGui->ActiveId == in_EDI) {
    if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
       (((GImGui->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
    else if ((GImGui->ActiveIdSource == ImGuiInputSource_Nav) &&
            ((GImGui->NavActivatePressedId == in_EDI &&
             ((GImGui->ActiveIdIsJustActivated & 1U) == 0)))) {
      ClearActiveID();
    }
  }
  if (pIVar3->ActiveId == in_EDI) {
    if ((((pIVar3->LastItemData).InFlags & 0x80U) == 0) && ((in_stack_00000008 & 0x200000) == 0)) {
      flags_00 = (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      v_max = (float)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      data_type_00 = (ImGuiDataType)in_stack_fffffffffffffef0;
      switch(in_ESI) {
      case 0:
        uVar1 = *(undefined1 *)in_RDX;
        local_1 = DragBehaviorT<int,int,float>
                            (data_type_00,(int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
                             ,(int)in_stack_fffffffffffffee0,(int)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        if (local_1) {
          *(undefined1 *)in_RDX = uVar1;
        }
        break;
      case 1:
        uVar1 = *(undefined1 *)in_RDX;
        local_1 = DragBehaviorT<unsigned_int,int,float>
                            (data_type_00,(uint *)in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee4,(uint)in_stack_fffffffffffffee0,(uint)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        if (local_1) {
          *(undefined1 *)in_RDX = uVar1;
        }
        break;
      case 2:
        uVar2 = *in_RDX;
        local_1 = DragBehaviorT<int,int,float>
                            (data_type_00,(int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
                             ,(int)in_stack_fffffffffffffee0,(int)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        if (local_1) {
          *in_RDX = uVar2;
        }
        break;
      case 3:
        uVar2 = *in_RDX;
        local_1 = DragBehaviorT<unsigned_int,int,float>
                            (data_type_00,(uint *)in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee4,(uint)in_stack_fffffffffffffee0,(uint)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        if (local_1) {
          *in_RDX = uVar2;
        }
        break;
      case 4:
        local_1 = DragBehaviorT<int,int,float>
                            (data_type_00,(int *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
                             ,(int)in_stack_fffffffffffffee0,(int)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        break;
      case 5:
        local_1 = DragBehaviorT<unsigned_int,int,float>
                            (data_type_00,(uint *)in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee4,(uint)in_stack_fffffffffffffee0,(uint)v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        break;
      case 6:
        if (in_RCX == (undefined8 *)0x0) {
          v = (longlong *)0x8000000000000000;
        }
        else {
          v = (longlong *)*in_RCX;
        }
        if (in_R8 == (longlong *)0x0) {
          v_min = 0x7fffffffffffffff;
        }
        else {
          v_min = *in_R8;
        }
        local_1 = DragBehaviorT<long_long,long_long,double>
                            (in_stack_ffffffffffffff00,v,(float)((ulong)v >> 0x20),v_min,
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
        break;
      case 7:
        local_1 = DragBehaviorT<unsigned_long_long,long_long,double>
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff24,
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
        break;
      case 8:
        local_1 = DragBehaviorT<float,float,float>
                            (data_type_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                             in_stack_fffffffffffffee0,v_max,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             flags_00);
        break;
      case 9:
        local_1 = DragBehaviorT<double,double,double>
                            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                             (float)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                             (double)in_stack_fffffffffffffee8,
                             (double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
        break;
      case 10:
      default:
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* p_v, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flags! Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        // Those are the things we can do easily outside the DragBehaviorT<> template, saves code generation.
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;
    if ((g.LastItemData.InFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS8*) p_min : IM_S8_MIN,  p_max ? *(const ImS8*)p_max  : IM_S8_MAX,  format, flags); if (r) *(ImS8*)p_v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU8*) p_min : IM_U8_MIN,  p_max ? *(const ImU8*)p_max  : IM_U8_MAX,  format, flags); if (r) *(ImU8*)p_v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS16*)p_min : IM_S16_MIN, p_max ? *(const ImS16*)p_max : IM_S16_MAX, format, flags); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU16*)p_min : IM_U16_MIN, p_max ? *(const ImU16*)p_max : IM_U16_MAX, format, flags); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)p_v,  v_speed, p_min ? *(const ImS32* )p_min : IM_S32_MIN, p_max ? *(const ImS32* )p_max : IM_S32_MAX, format, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)p_v,  v_speed, p_min ? *(const ImU32* )p_min : IM_U32_MIN, p_max ? *(const ImU32* )p_max : IM_U32_MAX, format, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)p_v,  v_speed, p_min ? *(const ImS64* )p_min : IM_S64_MIN, p_max ? *(const ImS64* )p_max : IM_S64_MAX, format, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)p_v,  v_speed, p_min ? *(const ImU64* )p_min : IM_U64_MIN, p_max ? *(const ImU64* )p_max : IM_U64_MAX, format, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)p_v,  v_speed, p_min ? *(const float* )p_min : -FLT_MAX,   p_max ? *(const float* )p_max : FLT_MAX,    format, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)p_v, v_speed, p_min ? *(const double*)p_min : -DBL_MAX,   p_max ? *(const double*)p_max : DBL_MAX,    format, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}